

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  Variant *pVVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  SPIRVariable *var;
  Bitset *pBVar11;
  char *pcVar12;
  char *addr_space;
  Bitset flags;
  Bitset local_c0;
  string *local_80;
  char **local_78;
  Bitset local_70;
  
  this_00 = &local_70.higher;
  local_70.lower = 0;
  local_70.higher._M_h._M_buckets = &local_70.higher._M_h._M_single_bucket;
  local_70.higher._M_h._M_bucket_count = 1;
  local_70.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.higher._M_h._M_element_count = 0;
  local_70.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar10 = (ulong)id;
  local_80 = __return_storage_ptr__;
  if ((uVar10 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar10].type == TypeVariable)) {
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar10);
  }
  else {
    var = (SPIRVariable *)0x0;
  }
  if (((var == (SPIRVariable *)0x0) || (*(int *)&(type->super_IVariant).field_0xc != 0xf)) ||
     ((bVar5 = Compiler::has_decoration
                         ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
      !bVar5 && (bVar5 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                    DecorationBufferBlock), !bVar5)))) {
    pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    local_70.lower = pBVar11->lower;
    if (pBVar11 != &local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&(pBVar11->higher)._M_h);
    }
  }
  else {
    Compiler::get_buffer_block_flags(&local_c0,(Compiler *)this,(VariableID)id);
    local_70.lower = local_c0.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&this_00->_M_h,&local_c0.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_c0.higher._M_h);
  }
  local_c0.lower = 0;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case StorageClassPushConstant:
    iVar9 = *(int *)&(type->super_IVariant).field_0xc;
    if (iVar9 == 0xf) {
      bVar5 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      pcVar12 = "const device";
      if (((uint)local_70.lower >> 0x18 & 1) == 0) {
        pcVar12 = "device";
      }
      local_c0.lower = (uint64_t)"constant";
      if (bVar5) {
        local_c0.lower = (uint64_t)pcVar12;
      }
    }
    else if (argument) {
      if (((iVar9 == 0x10) && ((type->image).dim == DimSubpassData)) &&
         ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
        local_c0.lower = 0x35b140;
      }
    }
    else {
      local_c0.lower = 0x371799;
    }
    break;
  case StorageClassInput:
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if ((((var != (SPIRVariable *)0x0) && (EVar7 == ExecutionModelTessellationControl)) &&
        ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) &&
       (local_c0.lower = 0x3717ca, (this->msl_options).multi_patch_workgroup != false)) {
      local_c0.lower = 0x371751;
    }
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if (((EVar7 == ExecutionModelTessellationEvaluation) && (var != (SPIRVariable *)0x0)) &&
       (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) {
      uVar1 = (var->basevariable).id;
      uVar2 = (this->stage_in_ptr_var_id).id;
      bVar5 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar6 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      uVar8 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      if ((uVar1 == uVar2) || (bVar5 && (!bVar6 || 1 < uVar8 - 0xb))) {
        local_c0.lower = 0x371751;
      }
    }
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar7 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
      local_c0.lower = 0x371697;
    }
    break;
  case StorageClassOutput:
    if (this->capture_output_to_buffer != true) break;
    if (var != (SPIRVariable *)0x0) {
      bVar5 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
      if (bVar5) {
        bVar5 = Compiler::is_tessellation_shader((Compiler *)this);
        if (bVar5) {
LAB_002c0204:
          local_c0.lower = 0x3717ca;
        }
        else {
          local_c0.lower = 0x371697;
        }
      }
      else {
        iVar9 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
        if ((char)iVar9 != '\0') goto LAB_002c0204;
      }
    }
    if ((char *)local_c0.lower != (char *)0x0) break;
    goto LAB_002c0218;
  case StorageClassWorkgroup:
    local_c0.lower = 0x3717ca;
    break;
  case StorageClassCrossWorkgroup:
  case StorageClassPrivate:
  case StorageClassFunction:
  case StorageClassGeneric:
  case StorageClassAtomicCounter:
  case StorageClassImage:
    break;
  default:
    if (type->storage != StorageClassPhysicalStorageBuffer) break;
  case StorageClassStorageBuffer:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
       bVar5)) {
      local_c0.lower = 0x371751;
      if ((local_70.lower & 0x1000000) == 0) {
        local_c0.lower = 0x371717;
      }
    }
    else {
LAB_002c0218:
      local_c0.lower = 0x371717;
    }
  }
  psVar4 = local_80;
  if ((char *)local_c0.lower == (char *)0x0) {
    local_c0.lower = 0x35b140;
    if (*(int *)&(type->super_IVariant).field_0xc == 0x15) {
      local_c0.lower = 0x371697;
    }
    if (!argument) {
      local_c0.lower = 0x35b140;
    }
    if (type->pointer != false) {
      local_c0.lower = 0x371697;
    }
  }
  local_78 = (char **)0x37b212;
  if ((local_70.lower & 0xa00000) == 0) {
    local_78 = (char **)0x35b140;
  }
  join<char_const*,char_const*&>(local_80,(spirv_cross *)&local_78,(char **)&local_c0,local_78);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  return psVar4;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	return join(flags.get(DecorationVolatile) || flags.get(DecorationCoherent) ? "volatile " : "", addr_space);
}